

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::MeshGeometry::MeshGeometry
          (MeshGeometry *this,uint64_t id,Element *element,string *name,Document *doc)

{
  pointer *this_00;
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  bool bVar4;
  Scope *pSVar5;
  Element *pEVar6;
  size_type sVar7;
  reference __x;
  reference pvVar8;
  reference piVar9;
  reference ppVar10;
  const_reference ppTVar11;
  ImportSettings *pIVar12;
  int local_390;
  int local_374;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *local_2a8;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *local_288;
  string *local_228;
  Scope *layer;
  string local_210;
  int local_1ec;
  char *pcStack_1e8;
  int index_2;
  char *err;
  TokenList *tokens;
  const_iterator it;
  int absi_1;
  int index_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<int,_std::allocator<int>_> *__range2_1;
  size_t e;
  size_t i;
  uint cursor;
  int local_178;
  int local_174;
  int absi;
  int index;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  size_type sStack_150;
  uint count;
  size_t vertex_count;
  undefined1 local_140 [8];
  vector<int,_std::allocator<int>_> tempFaces;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tempVerts;
  string local_108;
  ElementCollection local_e8;
  ElementCollection *local_d8;
  ElementCollection *Layer;
  string local_c8;
  Element *local_a8;
  Element *PolygonVertexIndex;
  string local_98;
  Element *local_78;
  Element *Vertices;
  string local_68;
  Scope *local_38;
  Scope *sc;
  Document *doc_local;
  string *name_local;
  Element *element_local;
  uint64_t id_local;
  MeshGeometry *this_local;
  
  sc = (Scope *)doc;
  doc_local = (Document *)name;
  name_local = (string *)element;
  element_local = (Element *)id;
  id_local = (uint64_t)this;
  Geometry::Geometry(&this->super_Geometry,id,element,name,doc);
  (this->super_Geometry).super_Object._vptr_Object = (_func_int **)&PTR__MeshGeometry_0110e910;
  std::vector<int,_std::allocator<int>_>::vector(&this->m_materials);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector(&this->m_vertices);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_faces);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_facesVertexStartIndices)
  ;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector(&this->m_tangents);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector(&this->m_binormals);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector(&this->m_normals);
  local_228 = (string *)&this->field_0x100;
  do {
    std::__cxx11::string::string(local_228);
    local_228 = local_228 + 0x20;
  } while (local_228 != (string *)this->m_uvs);
  local_288 = this->m_uvs;
  do {
    std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::vector(local_288);
    local_288 = local_288 + 1;
  } while ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)local_288 !=
           this->m_colors);
  local_2a8 = this->m_colors;
  do {
    std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::vector(local_2a8);
    local_2a8 = local_2a8 + 1;
  } while (local_2a8 !=
           (vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)&this->m_mapping_counts);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_mapping_counts);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_mapping_offsets);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_mappings);
  pSVar5 = Element::Compound((Element *)name_local);
  local_38 = pSVar5;
  if (pSVar5 != (Scope *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_98,"Vertices",(allocator *)((long)&PolygonVertexIndex + 7));
    pEVar6 = GetRequiredElement(pSVar5,&local_98,(Element *)name_local);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)((long)&PolygonVertexIndex + 7));
    pSVar5 = local_38;
    local_78 = pEVar6;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_c8,"PolygonVertexIndex",(allocator *)((long)&Layer + 7));
    pEVar6 = GetRequiredElement(pSVar5,&local_c8,(Element *)name_local);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&Layer + 7));
    pSVar5 = local_38;
    local_a8 = pEVar6;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_108,"Layer",
               (allocator *)
               ((long)&tempVerts.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_e8 = Scope::GetCollection(pSVar5,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&tempVerts.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_d8 = &local_e8;
    this_00 = &tempFaces.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)this_00);
    ParseVectorDataArray
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)this_00,local_78);
    bVar4 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                      ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                       &tempFaces.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if (bVar4) {
      LogFunctions<Assimp::FBXImporter>::LogWarn("encountered mesh with no vertices");
    }
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_140);
    ParseVectorDataArray((vector<int,_std::allocator<int>_> *)local_140,local_a8);
    bVar4 = std::vector<int,_std::allocator<int>_>::empty
                      ((vector<int,_std::allocator<int>_> *)local_140);
    if (bVar4) {
      LogFunctions<Assimp::FBXImporter>::LogWarn("encountered mesh with no faces");
    }
    sVar7 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_140);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
              (&this->m_vertices,sVar7);
    sVar7 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_140);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&this->m_faces,sVar7 / 3);
    sVar7 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                      ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                       &tempFaces.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->m_mapping_offsets,sVar7)
    ;
    sVar7 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                      ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                       &tempFaces.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    vertex_count._4_4_ = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->m_mapping_counts,sVar7,(value_type_conflict4 *)((long)&vertex_count + 4));
    sVar7 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_140);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->m_mappings,sVar7);
    sStack_150 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                           ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                            &tempFaces.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
    __range2._4_4_ = 0;
    __end2 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)local_140);
    _absi = std::vector<int,_std::allocator<int>_>::end
                      ((vector<int,_std::allocator<int>_> *)local_140);
    while( true ) {
      bVar4 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)&absi);
      if (!bVar4) {
        i._0_4_ = 0;
        e = 0;
        sVar7 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                          ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                           &tempFaces.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        for (; vVar3 = (value_type)i, e < sVar7; e = e + 1) {
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&this->m_mapping_offsets,e);
          *pvVar8 = vVar3;
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&this->m_mapping_counts,e);
          i._0_4_ = *pvVar8 + (value_type)i;
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&this->m_mapping_counts,e);
          *pvVar8 = 0;
        }
        i._0_4_ = 0;
        __end2_1 = std::vector<int,_std::allocator<int>_>::begin
                             ((vector<int,_std::allocator<int>_> *)local_140);
        _absi_1 = std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)local_140);
        while( true ) {
          bVar4 = __gnu_cxx::operator!=
                            (&__end2_1,
                             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             &absi_1);
          if (!bVar4) break;
          piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&__end2_1);
          vVar3 = (value_type)i;
          it._M_node._4_4_ = *piVar9;
          local_390 = it._M_node._4_4_;
          if (it._M_node._4_4_ < 0) {
            local_390 = -1 - it._M_node._4_4_;
          }
          it._M_node._0_4_ = local_390;
          i._0_4_ = (value_type)i + 1;
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&this->m_mapping_offsets,(long)local_390);
          vVar1 = *pvVar8;
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&this->m_mapping_counts,(long)(int)it._M_node);
          vVar2 = *pvVar8;
          *pvVar8 = vVar2 + 1;
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&this->m_mappings,(ulong)(vVar1 + vVar2));
          *pvVar8 = vVar3;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end2_1);
        }
        tokens = (TokenList *)(local_d8->first)._M_node;
        while( true ) {
          bVar4 = std::operator!=((_Self *)&tokens,&local_d8->second);
          if (!bVar4) {
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)local_140);
            std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
                      ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                       &tempFaces.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
            return;
          }
          ppVar10 = std::
                    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
                    ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
                                 *)&tokens);
          err = (char *)Element::Tokens(ppVar10->second);
          ppTVar11 = std::
                     vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                     ::operator[]((vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                                   *)err,0);
          local_1ec = ParseTokenAsInt(*ppTVar11,&stack0xfffffffffffffe18);
          if (pcStack_1e8 != (char *)0x0) break;
          pIVar12 = Document::Settings((Document *)sc);
          if (((pIVar12->readAllLayers & 1U) == 0) && (local_1ec != 0)) {
            LogFunctions<Assimp::FBXImporter>::LogWarn("ignoring additional geometry layers");
          }
          else {
            ppVar10 = std::
                      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
                      ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
                                   *)&tokens);
            pSVar5 = GetRequiredScope(ppVar10->second);
            ReadLayer(this,pSVar5);
          }
          std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
          ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
                        *)&tokens);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_210,pcStack_1e8,(allocator *)((long)&layer + 7));
        Util::DOMError(&local_210,(Element *)name_local);
      }
      piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      local_174 = *piVar9;
      local_374 = local_174;
      if (local_174 < 0) {
        local_374 = -1 - local_174;
      }
      local_178 = local_374;
      if (sStack_150 <= (ulong)(long)local_374) break;
      __x = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                      ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                       &tempFaces.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(long)local_374);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                (&this->m_vertices,__x);
      __range2._4_4_ = __range2._4_4_ + 1;
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_mapping_counts,(long)local_178);
      *pvVar8 = *pvVar8 + 1;
      if (local_174 < 0) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->m_faces,(value_type_conflict4 *)((long)&__range2 + 4));
        __range2._4_4_ = 0;
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&cursor,"polygon vertex index out of range",(allocator *)((long)&i + 7));
    Util::DOMError((string *)&cursor,local_a8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_68,"failed to read Geometry object (class: Mesh), no data scope found"
             ,(allocator *)((long)&Vertices + 7));
  Util::DOMError(&local_68,(Element *)0x0);
}

Assistant:

MeshGeometry::MeshGeometry(uint64_t id, const Element& element, const std::string& name, const Document& doc)
: Geometry(id, element,name, doc)
{
    const Scope* sc = element.Compound();
    if (!sc) {
        DOMError("failed to read Geometry object (class: Mesh), no data scope found");
    }

    // must have Mesh elements:
    const Element& Vertices = GetRequiredElement(*sc,"Vertices",&element);
    const Element& PolygonVertexIndex = GetRequiredElement(*sc,"PolygonVertexIndex",&element);

    // optional Mesh elements:
    const ElementCollection& Layer = sc->GetCollection("Layer");

    std::vector<aiVector3D> tempVerts;
    ParseVectorDataArray(tempVerts,Vertices);

    if(tempVerts.empty()) {
        FBXImporter::LogWarn("encountered mesh with no vertices");
    }

    std::vector<int> tempFaces;
    ParseVectorDataArray(tempFaces,PolygonVertexIndex);

    if(tempFaces.empty()) {
        FBXImporter::LogWarn("encountered mesh with no faces");
    }

    m_vertices.reserve(tempFaces.size());
    m_faces.reserve(tempFaces.size() / 3);

    m_mapping_offsets.resize(tempVerts.size());
    m_mapping_counts.resize(tempVerts.size(),0);
    m_mappings.resize(tempFaces.size());

    const size_t vertex_count = tempVerts.size();

    // generate output vertices, computing an adjacency table to
    // preserve the mapping from fbx indices to *this* indexing.
    unsigned int count = 0;
    for(int index : tempFaces) {
        const int absi = index < 0 ? (-index - 1) : index;
        if(static_cast<size_t>(absi) >= vertex_count) {
            DOMError("polygon vertex index out of range",&PolygonVertexIndex);
        }

        m_vertices.push_back(tempVerts[absi]);
        ++count;

        ++m_mapping_counts[absi];

        if (index < 0) {
            m_faces.push_back(count);
            count = 0;
        }
    }

    unsigned int cursor = 0;
    for (size_t i = 0, e = tempVerts.size(); i < e; ++i) {
        m_mapping_offsets[i] = cursor;
        cursor += m_mapping_counts[i];

        m_mapping_counts[i] = 0;
    }

    cursor = 0;
    for(int index : tempFaces) {
        const int absi = index < 0 ? (-index - 1) : index;
        m_mappings[m_mapping_offsets[absi] + m_mapping_counts[absi]++] = cursor++;
    }

    // if settings.readAllLayers is true:
    //  * read all layers, try to load as many vertex channels as possible
    // if settings.readAllLayers is false:
    //  * read only the layer with index 0, but warn about any further layers
    for (ElementMap::const_iterator it = Layer.first; it != Layer.second; ++it) {
        const TokenList& tokens = (*it).second->Tokens();

        const char* err;
        const int index = ParseTokenAsInt(*tokens[0], err);
        if(err) {
            DOMError(err,&element);
        }

        if(doc.Settings().readAllLayers || index == 0) {
            const Scope& layer = GetRequiredScope(*(*it).second);
            ReadLayer(layer);
        }
        else {
            FBXImporter::LogWarn("ignoring additional geometry layers");
        }
    }
}